

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

FString V_GetColorStringByName(char *name)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *in_RSI;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  FString __s1;
  char *pcVar9;
  FMemLump rgbNames;
  int c [3];
  char *local_70;
  FString *local_68;
  FMemLump local_60;
  FMemLump local_58;
  char *local_50;
  uint local_44 [3];
  DWORD *local_38;
  
  local_68 = (FString *)name;
  local_50 = in_RSI;
  FMemLump::FMemLump(&local_60);
  iVar3 = FWadCollection::GetNumLumps(&Wads);
  if (iVar3 != 0) {
    iVar3 = FWadCollection::CheckNumForName(&Wads,"X11R6RGB",0);
    if (iVar3 == -1) {
      pcVar6 = "X11R6RGB lump not found\n";
LAB_00584640:
      Printf(pcVar6);
    }
    else {
      FWadCollection::ReadLump((FWadCollection *)&local_58,0xa861c0);
      FMemLump::operator=(&local_60,&local_58);
      FMemLump::~FMemLump(&local_58);
      iVar1 = *(int *)((long)local_60.Block.Chars - 0xc);
      iVar3 = FWadCollection::LumpLength(&Wads,iVar3);
      pcVar6 = (char *)0x0;
      if (iVar1 == 0) {
        local_60.Block.Chars = (FString)(FString)pcVar6;
      }
      local_38 = (DWORD *)strlen(local_50);
      if (0 < iVar3) {
        pcVar8 = (char *)((long)local_60.Block.Chars + (long)iVar3);
        __s1 = local_60.Block.Chars;
        do {
          if (*__s1.Chars < '!') {
            do {
              pcVar9 = __s1.Chars + 1;
              if (pcVar8 <= pcVar9) break;
              __s1.Chars = pcVar9;
            } while (*pcVar9 < '!');
          }
          else {
            uVar7 = (uint)pcVar6;
            if ((uVar7 == 0) && (*__s1.Chars == '!')) {
              do {
                pcVar9 = __s1.Chars + 1;
                pcVar6 = (char *)0x0;
                if (pcVar8 <= pcVar9) break;
                __s1.Chars = pcVar9;
              } while (*pcVar9 != '\n');
            }
            else {
              pcVar6 = __s1.Chars;
              if ((int)uVar7 < 3) {
                uVar4 = strtoul(__s1.Chars,&local_70,10);
                local_44[(int)uVar7] = (uint)uVar4;
                if (local_70 == __s1.Chars) {
LAB_0058467b:
                  pcVar6 = "X11R6RGB lump is corrupt\n";
                  goto LAB_00584640;
                }
                pcVar6 = (char *)(ulong)(uVar7 + 1);
                pcVar9 = local_70;
              }
              else {
                for (; (local_70 = pcVar6, pcVar6 < pcVar8 && (*pcVar6 != '\n'));
                    pcVar6 = pcVar6 + 1) {
                }
                for (; (__s1.Chars < pcVar6 && (local_70 = pcVar6, *pcVar6 < '!'));
                    pcVar6 = pcVar6 + -1) {
                  local_70 = __s1.Chars;
                }
                if (local_70 == __s1.Chars) goto LAB_0058467b;
                pcVar9 = local_70 + 1;
                bVar2 = true;
                uVar5 = 0;
                local_70 = pcVar9;
                if (((DWORD *)(pcVar9 + -(long)__s1.Chars) == local_38) &&
                   (iVar3 = strncasecmp(__s1.Chars,local_50,(size_t)(pcVar9 + -(long)__s1.Chars)),
                   iVar3 == 0)) {
                  local_68->Chars = FString::NullString.Nothing;
                  FString::NullString.RefCount = FString::NullString.RefCount + 1;
                  bVar2 = false;
                  FString::Format(local_68,"#%02x%02x%02x",(ulong)local_44[0],(ulong)local_44[1],
                                  (ulong)local_44[2]);
                  pcVar9 = __s1.Chars;
                  uVar5 = uVar7;
                }
                pcVar6 = (char *)(ulong)uVar5;
                if (!bVar2) goto LAB_0058465d;
              }
            }
          }
          __s1.Chars = pcVar9;
        } while (pcVar9 < pcVar8);
      }
    }
  }
  local_68->Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
LAB_0058465d:
  FMemLump::~FMemLump(&local_60);
  return (FString)(char *)local_68;
}

Assistant:

FString V_GetColorStringByName (const char *name)
{
	FMemLump rgbNames;
	char *rgbEnd;
	char *rgb, *endp;
	int rgblump;
	int c[3], step;
	size_t namelen;

	if (Wads.GetNumLumps()==0) return FString();

	rgblump = Wads.CheckNumForName ("X11R6RGB");
	if (rgblump == -1)
	{
		Printf ("X11R6RGB lump not found\n");
		return FString();
	}

	rgbNames = Wads.ReadLump (rgblump);
	rgb = (char *)rgbNames.GetMem();
	rgbEnd = rgb + Wads.LumpLength (rgblump);
	step = 0;
	namelen = strlen (name);

	while (rgb < rgbEnd)
	{
		// Skip white space
		if (*rgb <= ' ')
		{
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb <= ' ');
		}
		else if (step == 0 && *rgb == '!')
		{ // skip comment lines
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb != '\n');
		}
		else if (step < 3)
		{ // collect RGB values
			c[step++] = strtoul (rgb, &endp, 10);
			if (endp == rgb)
			{
				break;
			}
			rgb = endp;
		}
		else
		{ // Check color name
			endp = rgb;
			// Find the end of the line
			while (endp < rgbEnd && *endp != '\n')
				endp++;
			// Back up over any whitespace
			while (endp > rgb && *endp <= ' ')
				endp--;
			if (endp == rgb)
			{
				break;
			}
			size_t checklen = ++endp - rgb;
			if (checklen == namelen && strnicmp (rgb, name, checklen) == 0)
			{
				FString descr;
				descr.Format ("#%02x%02x%02x", c[0], c[1], c[2]);
				return descr;
			}
			rgb = endp;
			step = 0;
		}
	}
	if (rgb < rgbEnd)
	{
		Printf ("X11R6RGB lump is corrupt\n");
	}
	return FString();
}